

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O1

void __thiscall ProblemFOBSFireFightingFactored::SetYScopes(ProblemFOBSFireFightingFactored *this)

{
  ulong uVar1;
  Index agI;
  uint uVar2;
  ulong uVar3;
  Index y;
  Scope x;
  Scope allAgents;
  Scope local_a8;
  string local_88;
  Scope local_68;
  Scope local_48;
  
  local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  uVar3 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete
                                   .super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    uVar2 = (uint)uVar3;
    if (uVar1 <= uVar3) break;
    local_88._M_dataplus._M_p._0_4_ = uVar2;
    if (local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                 (iterator)
                 local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_88);
    }
    else {
      *local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar2;
      local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar3 = (ulong)(uVar2 + 1);
  }
  if (*(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.field_0x710 != 0)
  {
    uVar3 = 0;
    do {
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      y = (Index)uVar3;
      if (y != 0) {
        local_88._M_dataplus._M_p._0_4_ = y - 1;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,(iterator)0x0,
                   (uint *)&local_88);
      }
      if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        local_88._M_dataplus._M_p._0_4_ = y;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,
                   (iterator)
                   local_a8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_88);
      }
      else {
        *local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = y;
        local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (uVar3 < *(long *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                            field_0x710 - 1U) {
        local_88._M_dataplus._M_p._0_4_ = y + 1;
        if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,
                     (iterator)
                     local_a8.super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(uint *)&local_88);
        }
        else {
          *local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish = y + 1;
          local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"<>","");
      Scope::Scope(&local_48,&local_88);
      TwoStageDynamicBayesianNetwork::SetSoI_Y
                (&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                  super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn,y,&local_a8,
                 &local_68,&local_48);
      if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar3 = (ulong)(y + 1);
    } while (uVar3 < *(ulong *)&(this->super_FactoredMMDPDiscrete).super_FactoredDecPOMDPDiscrete.
                                field_0x710);
  }
  if (local_68.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProblemFOBSFireFightingFactored::SetYScopes()
{    
    //specify connections for the 2DBN
#if DEBUG_PFFF
    cout << "About to set the SoIs for all next-stage(NS) SFs Y..."<<endl;
#endif
    Scope allAgents;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        allAgents.Insert(agI);
    for(Index yI=0; yI < _m_nrHouses; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        if(yI > 0)
            x.Insert(yI-1);
        x.Insert(yI); // firelevel of house yI influenced by its PS firelevel
        if(yI < (_m_nrHouses-1) )
            x.Insert(yI+1);

        SetSoI_Y( yI, //sfacI = 0 -> house 0
                  x,
                  allAgents,
                  Scope("<>") // no interdependencies between next-stage FLs
                  );
    }
}